

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O0

void test_get_ngram_index(void)

{
  int iVar1;
  char *test_string;
  
  iVar1 = get_ngram_index("BSTITUTE",1);
  UnityAssertEqualNumber(1,(long)iVar1,(char *)0x0,0x17,UNITY_DISPLAY_STYLE_INT);
  iVar1 = get_ngram_index("TITUTE",1);
  UnityAssertEqualNumber(0x13,(long)iVar1,(char *)0x0,0x18,UNITY_DISPLAY_STYLE_INT);
  iVar1 = get_ngram_index("AAAA SOME OTHER TEXT",4);
  UnityAssertEqualNumber(0,(long)iVar1,(char *)0x0,0x1b,UNITY_DISPLAY_STYLE_INT);
  iVar1 = get_ngram_index("NINXXXAUDHAIDF",4);
  UnityAssertEqualNumber(0x39311,(long)iVar1,(char *)0x0,0x1c,UNITY_DISPLAY_STYLE_INT);
  iVar1 = get_ngram_index("TIQT",4);
  UnityAssertEqualNumber(0x52f4b,(long)iVar1,(char *)0x0,0x1d,UNITY_DISPLAY_STYLE_INT);
  iVar1 = get_ngram_index("ZZZZ",4);
  UnityAssertEqualNumber(0x6f90f,(long)iVar1,(char *)0x0,0x1e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

void test_get_ngram_index(void)
{
	// Test monograms
	char *test_string = "SUBSTITUTE";
	TEST_ASSERT_EQUAL_INT(1, get_ngram_index(test_string + 2, 1));
	TEST_ASSERT_EQUAL_INT(19, get_ngram_index(test_string + 4, 1));

	// Test quadgrams
	TEST_ASSERT_EQUAL_INT(0, get_ngram_index("AAAA SOME OTHER TEXT", 4));
	TEST_ASSERT_EQUAL_INT(234257, get_ngram_index("NINXXXAUDHAIDF", 4));
	TEST_ASSERT_EQUAL_INT(339787, get_ngram_index("TIQT", 4));
	TEST_ASSERT_EQUAL_INT(456975, get_ngram_index("ZZZZ", 4));
}